

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O2

DataChunk * duckdb::SortKeyLeastGreatest::Prepare(DataChunk *args,ExpressionState *state)

{
  undefined4 uVar1;
  idx_t input_count;
  FunctionLocalState *pFVar2;
  reference input;
  reference result;
  idx_t c_idx;
  ulong __n;
  DataChunk *this;
  optional_ptr<duckdb::FunctionLocalState,_true> local_38;
  
  local_38.ptr = (FunctionLocalState *)state[1]._vptr_ExpressionState;
  pFVar2 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->(&local_38);
  this = (DataChunk *)(pFVar2 + 1);
  DataChunk::Reset(this);
  for (__n = 0; __n < (ulong)(((long)(args->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(args->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x68);
      __n = __n + 1) {
    input = vector<duckdb::Vector,_true>::get<true>(&args->data,__n);
    input_count = args->count;
    uVar1 = *(undefined4 *)&pFVar2[0x16]._vptr_FunctionLocalState;
    result = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this,__n);
    CreateSortKeyHelpers::CreateSortKey(input,input_count,SUB42(uVar1,0),result);
  }
  pFVar2[4]._vptr_FunctionLocalState = (_func_int **)args->count;
  return this;
}

Assistant:

static DataChunk &Prepare(DataChunk &args, ExpressionState &state) {
		auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<LeastGreatestSortKeyState>();
		lstate.sort_keys.Reset();
		for (idx_t c_idx = 0; c_idx < args.ColumnCount(); c_idx++) {
			CreateSortKeyHelpers::CreateSortKey(args.data[c_idx], args.size(), lstate.modifiers,
			                                    lstate.sort_keys.data[c_idx]);
		}
		lstate.sort_keys.SetCardinality(args.size());
		return lstate.sort_keys;
	}